

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLinearSumBounds.cpp
# Opt level: O2

void __thiscall
HighsLinearSumBounds::updatedVarLower
          (HighsLinearSumBounds *this,HighsInt sum,HighsInt var,double coefficient,
          double oldVarLower)

{
  int *piVar1;
  double dVar2;
  pointer piVar3;
  HighsCDouble *this_00;
  double dVar4;
  double dVar5;
  
  dVar4 = oldVarLower;
  if (this->implVarLowerSource[var] == sum) {
    dVar5 = this->varLower[var];
  }
  else {
    dVar2 = this->implVarLower[var];
    if (oldVarLower <= dVar2) {
      dVar4 = dVar2;
    }
    dVar5 = this->varLower[var];
    if (this->varLower[var] <= dVar2) {
      dVar5 = dVar2;
    }
  }
  if (coefficient <= 0.0) {
    if ((dVar5 != dVar4) || (NAN(dVar5) || NAN(dVar4))) {
      if (-INFINITY < dVar4) {
        HighsCDouble::operator-=
                  ((this->sumUpper).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                   _M_impl.super__Vector_impl_data._M_start + sum,dVar4 * coefficient);
      }
      else {
        piVar1 = (this->numInfSumUpper).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + sum;
        *piVar1 = *piVar1 + -1;
      }
      if (-INFINITY < dVar5) {
        HighsCDouble::operator+=
                  ((this->sumUpper).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                   _M_impl.super__Vector_impl_data._M_start + sum,dVar5 * coefficient);
      }
      else {
        piVar1 = (this->numInfSumUpper).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + sum;
        *piVar1 = *piVar1 + 1;
      }
    }
    if (-INFINITY < oldVarLower) {
      HighsCDouble::operator-=
                ((this->sumUpperOrig).
                 super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                 super__Vector_impl_data._M_start + sum,oldVarLower * coefficient);
    }
    else {
      piVar1 = (this->numInfSumUpperOrig).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + sum;
      *piVar1 = *piVar1 + -1;
    }
    dVar4 = this->varLower[var];
    if (-INFINITY < dVar4) {
      this_00 = (this->sumUpperOrig).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>
                ._M_impl.super__Vector_impl_data._M_start + sum;
      goto LAB_0035e279;
    }
    piVar3 = (this->numInfSumUpperOrig).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  else {
    if ((dVar5 != dVar4) || (NAN(dVar5) || NAN(dVar4))) {
      if (-INFINITY < dVar4) {
        HighsCDouble::operator-=
                  ((this->sumLower).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                   _M_impl.super__Vector_impl_data._M_start + sum,dVar4 * coefficient);
      }
      else {
        piVar1 = (this->numInfSumLower).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + sum;
        *piVar1 = *piVar1 + -1;
      }
      if (-INFINITY < dVar5) {
        HighsCDouble::operator+=
                  ((this->sumLower).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                   _M_impl.super__Vector_impl_data._M_start + sum,dVar5 * coefficient);
      }
      else {
        piVar1 = (this->numInfSumLower).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + sum;
        *piVar1 = *piVar1 + 1;
      }
    }
    if (-INFINITY < oldVarLower) {
      HighsCDouble::operator-=
                ((this->sumLowerOrig).
                 super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                 super__Vector_impl_data._M_start + sum,oldVarLower * coefficient);
    }
    else {
      piVar1 = (this->numInfSumLowerOrig).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + sum;
      *piVar1 = *piVar1 + -1;
    }
    dVar4 = this->varLower[var];
    if (-INFINITY < dVar4) {
      this_00 = (this->sumLowerOrig).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>
                ._M_impl.super__Vector_impl_data._M_start + sum;
LAB_0035e279:
      HighsCDouble::operator+=(this_00,dVar4 * coefficient);
      return;
    }
    piVar3 = (this->numInfSumLowerOrig).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  piVar3[sum] = piVar3[sum] + 1;
  return;
}

Assistant:

void HighsLinearSumBounds::updatedVarLower(HighsInt sum, HighsInt var,
                                           double coefficient,
                                           double oldVarLower) {
  double oldVLower = implVarLowerSource[var] == sum
                         ? oldVarLower
                         : std::max(implVarLower[var], oldVarLower);

  double vLower = implVarLowerSource[var] == sum
                      ? varLower[var]
                      : std::max(implVarLower[var], varLower[var]);

  if (coefficient > 0) {
    if (vLower != oldVLower) {
      if (oldVLower == -kHighsInf)
        numInfSumLower[sum] -= 1;
      else
        sumLower[sum] -= oldVLower * coefficient;

      if (vLower == -kHighsInf)
        numInfSumLower[sum] += 1;
      else
        sumLower[sum] += vLower * coefficient;
    }

    if (oldVarLower == -kHighsInf)
      numInfSumLowerOrig[sum] -= 1;
    else
      sumLowerOrig[sum] -= oldVarLower * coefficient;

    if (varLower[var] == -kHighsInf)
      numInfSumLowerOrig[sum] += 1;
    else
      sumLowerOrig[sum] += varLower[var] * coefficient;

  } else {
    if (vLower != oldVLower) {
      if (oldVLower == -kHighsInf)
        numInfSumUpper[sum] -= 1;
      else
        sumUpper[sum] -= oldVLower * coefficient;

      if (vLower == -kHighsInf)
        numInfSumUpper[sum] += 1;
      else
        sumUpper[sum] += vLower * coefficient;
    }
    if (oldVarLower == -kHighsInf)
      numInfSumUpperOrig[sum] -= 1;
    else
      sumUpperOrig[sum] -= oldVarLower * coefficient;

    if (varLower[var] == -kHighsInf)
      numInfSumUpperOrig[sum] += 1;
    else
      sumUpperOrig[sum] += varLower[var] * coefficient;
  }
}